

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt_converter.cpp
# Opt level: O0

bool booster::locale::util::check_is_simple_encoding(string *encoding)

{
  bool bVar1;
  char **in_RDI;
  char **unaff_retaddr;
  string norm;
  char *in_stack_ffffffffffffffd8;
  _func_bool_char_ptr_char_ptr *in_stack_ffffffffffffffe8;
  char **in_stack_fffffffffffffff0;
  
  std::__cxx11::string::c_str();
  conv::impl::normalize_encoding_abi_cxx11_(in_stack_ffffffffffffffd8);
  std::__cxx11::string::c_str();
  bVar1 = std::binary_search<char_const**,char_const*,bool(*)(char_const*,char_const*)>
                    (unaff_retaddr,in_RDI,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return bVar1;
}

Assistant:

bool check_is_simple_encoding(std::string const &encoding)
    {
        std::string norm = conv::impl::normalize_encoding(encoding.c_str());
        return std::binary_search<char const **>( simple_encoding_table,
                        simple_encoding_table + sizeof(simple_encoding_table)/sizeof(char const *),
                        norm.c_str(),
                        compare_strings);
        return 0;
    }